

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdShll(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx->vmState->x86ShllWrap = x86ShllWrap;
  ctx_local._2_1_ = cmd.rB;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)ctx_local._2_1_ << 3);
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  GenCodeLoadInt32FromPointer(ctx,rEDX,rECX,ctx_local._3_1_,ctx_local._4_4_);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_sal64,rEAX,rECX);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,rEAX);
  return;
}

Assistant:

void GenCodeCmdShll(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->x86ShllWrap = x86ShllWrap;

#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rB * 8); // Load lhs

	GenCodeLoadInt32FromPointer(ctx, rRDX, rECX, cmd.rC, cmd.argument); // Load lower int bits ot the rhs value

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_sal64, rRAX, rECX);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, rRAX); // Store long to target
#else
	// Load long RHS value into EAX:EDX
	x86GenCodeLoadInt64FromPointer(ctx, rEDX, rEAX, rEDX, cmd.rC, cmd.argument);

	EMIT_OP_REG(ctx.ctx, o_push, rEDX);
	EMIT_OP_REG(ctx.ctx, o_push, rEAX);

	// Load long LHS value into EAX:EDX
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rB * 8 + 4);

	EMIT_OP_REG(ctx.ctx, o_push, rEDX);
	EMIT_OP_REG(ctx.ctx, o_push, rEAX);

	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->x86ShllWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 16);

	// Send long in EAX:EDX
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX);
#endif
}